

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O1

QString * maybeEncodeTag(QString *__return_storage_ptr__,QCborContainerPrivate *d)

{
  Element *pEVar1;
  QCborTag encoding;
  ulong uVar2;
  char *pcVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QByteArrayView bytes;
  QUuid local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = (d->elements).d.ptr;
  encoding = (pEVar1->field_0).value;
  if ((long)encoding < 0x20) {
    if (encoding - 0x15 < 3) {
      if (pEVar1[1].type == ByteArray) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          encodeByteArray(__return_storage_ptr__,d,1,encoding);
          return __return_storage_ptr__;
        }
        goto LAB_002f4884;
      }
    }
    else if (encoding == 0) {
LAB_002f47b3:
      if (pEVar1[1].type == String) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
          makeString(__return_storage_ptr__,d,1,FromRaw);
          return __return_storage_ptr__;
        }
        goto LAB_002f4884;
      }
    }
  }
  else if (encoding == 0x25) {
    uVar2._0_4_ = pEVar1[1].type;
    uVar2._4_4_ = pEVar1[1].flags;
    bytes.m_data = (storage_type *)((uVar2 & 0x200000000) >> 0x21);
    pcVar3 = (d->data).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    plVar4 = (long *)(pcVar3 + pEVar1[1].field_0.value);
    if (bytes.m_data == (storage_type *)0x0) {
      plVar4 = (long *)0x0;
    }
    if ((((uVar2 & 0x200000000) != 0) && (pEVar1[1].type == ByteArray)) && (*plVar4 == 0x10)) {
      bytes.m_size = plVar4 + 1;
      local_20 = QUuid::fromRfc4122((QUuid *)*plVar4,bytes);
      QUuid::toString(__return_storage_ptr__,&local_20,WithoutBraces);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        return __return_storage_ptr__;
      }
      goto LAB_002f4884;
    }
  }
  else if (encoding == 0x20) goto LAB_002f47b3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_002f4884:
  __stack_chk_fail();
}

Assistant:

static QString maybeEncodeTag(const QCborContainerPrivate *d)
{
    qint64 tag = d->elements.at(0).value;
    const Element &e = d->elements.at(1);

    switch (tag) {
    case qint64(QCborKnownTags::DateTimeString):
    case qint64(QCborKnownTags::Url):
        if (e.type == QCborValue::String)
            return makeString(d, 1);
        break;

    case qint64(QCborKnownTags::ExpectedBase64url):
    case qint64(QCborKnownTags::ExpectedBase64):
    case qint64(QCborKnownTags::ExpectedBase16):
        if (e.type == QCborValue::ByteArray)
            return encodeByteArray(d, 1, QCborTag(tag));
        break;

    case qint64(QCborKnownTags::Uuid):
#ifndef QT_BOOTSTRAPPED
        if (const ByteData *b = d->byteData(e); e.type == QCborValue::ByteArray && b
                && b->len == sizeof(QUuid))
            return QUuid::fromRfc4122(b->asByteArrayView()).toString(QUuid::WithoutBraces);
#endif
        break;
    }

    // don't know what to do, bail out
    return QString();
}